

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void swrenderer::Cmd_r_visibility(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *__nptr;
  double vis;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    R_GetVisibility();
    Printf("Visibility is %g\n");
  }
  else if ((netgame & 1U) == 0) {
    __nptr = FCommandLine::operator[](argv,1);
    vis = atof(__nptr);
    R_SetVisibility(vis);
  }
  else {
    Printf("Visibility cannot be changed in net games.\n");
  }
  return;
}

Assistant:

CCMD (r_visibility)
{
	if (argv.argc() < 2)
	{
		Printf ("Visibility is %g\n", R_GetVisibility());
	}
	else if (!netgame)
	{
		R_SetVisibility(atof(argv[1]));
	}
	else
	{
		Printf ("Visibility cannot be changed in net games.\n");
	}
}